

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  uint iteration;
  long lVar2;
  
  lVar2 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Test iteration: ",0x10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    test_absolute_time();
    test_condition_timing_out();
    test_locked_semaphore_getting_unlocked();
    test_usleep();
    test_multiple_semaphores_waiting();
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x2711);
  return 0;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
    for (unsigned iteration = 1; iteration <= 10000; ++iteration) {
        std::cout << "Test iteration: " << iteration << "\n";
        test_absolute_time();
        test_condition_timing_out();
        test_locked_semaphore_getting_unlocked();
        test_usleep();
        test_multiple_semaphores_waiting();
    }

    return 0;
}